

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
::fulfill(AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
          *this,WebSocketResponse *value)

{
  undefined1 local_1b0 [416];
  
  if (this->waiting == true) {
    this->waiting = false;
    ExceptionOr<kj::HttpClient::WebSocketResponse>::ExceptionOr
              ((ExceptionOr<kj::HttpClient::WebSocketResponse> *)local_1b0,value);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::operator=
              (&this->result,(ExceptionOr<kj::HttpClient::WebSocketResponse> *)local_1b0);
    if (local_1b0[0x160] == true) {
      OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>::destroy
                ((OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_> *)
                 (local_1b0 + 0x188));
    }
    if (local_1b0[0] == true) {
      Exception::~Exception((Exception *)(local_1b0 + 8));
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }